

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O3

void google::ReprintFatalMessage(void)

{
  int iVar1;
  undefined8 uVar2;
  size_t sVar3;
  LogDestination *this;
  long lVar4;
  bool bVar5;
  
  if (fatal_message != '\0') {
    sVar3 = strlen(&fatal_message);
    if (fLB::FLAGS_logtostderr == 0) {
      fwrite(&fatal_message,(long)(int)sVar3,1,_stderr);
    }
    uVar2 = fatal_time;
    if ((fLB::FLAGS_logtostderr & 1) != 0) {
      ColoredWriteToStderr(2,&fatal_message,(long)(int)sVar3);
      return;
    }
    lVar4 = 2;
    do {
      iVar1 = fLI::FLAGS_logbuflevel;
      this = (LogDestination *)(&LogDestination::log_destinations_)[lVar4];
      if (this == (LogDestination *)0x0) {
        this = (LogDestination *)operator_new(0xe0);
        LogDestination::LogDestination(this,(LogSeverity)lVar4,(char *)0x0);
        (&LogDestination::log_destinations_)[lVar4] = this;
      }
      (*this->logger_->_vptr_Logger[2])
                (this->logger_,(ulong)(iVar1 < (LogSeverity)lVar4),uVar2,&fatal_message,
                 sVar3 & 0xffffffff);
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar5);
  }
  return;
}

Assistant:

void ReprintFatalMessage() {
  if (fatal_message[0]) {
    const int n = strlen(fatal_message);
    if (!FLAGS_logtostderr) {
      // Also write to stderr (don't color to avoid terminal checks)
      WriteToStderr(fatal_message, n);
    }
    LogDestination::LogToAllLogfiles(GLOG_ERROR, fatal_time, fatal_message, n);
  }
}